

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::MaxBipartiteMatchState::~MaxBipartiteMatchState(MaxBipartiteMatchState *this)

{
  pointer puVar1;
  
  puVar1 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

explicit MaxBipartiteMatchState(const MatchMatrix& graph)
      : graph_(&graph),
        left_(graph_->LhsSize(), kUnused),
        right_(graph_->RhsSize(), kUnused) {
  }